

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O1

void __thiscall VideoNode::paint(VideoNode *this,float dt,Timecode *tc,IScope *scope)

{
  int iVar1;
  VideoEngine *pVVar2;
  int in_ECX;
  
  paint::frame_seq = paint::frame_seq + 1;
  iVar1 = PolledPipelineDesc::poll
                    ((this->polled_pipeline)._M_t.
                     super___uniq_ptr_impl<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_PolledPipelineDesc_*,_std::default_delete<PolledPipelineDesc>_>
                     .super__Head_base<0UL,_PolledPipelineDesc_*,_false>._M_head_impl,
                     (pollfd *)(ulong)paint::frame_seq,(nfds_t)scope,in_ECX);
  if ((char)iVar1 != '\0') {
    pVVar2 = (VideoEngine *)operator_new(0x80);
    VideoEngine::VideoEngine
              (pVVar2,(this->resources)._M_t.
                      super___uniq_ptr_impl<Resources,_std::default_delete<Resources>_>._M_t.
                      super__Tuple_impl<0UL,_Resources_*,_std::default_delete<Resources>_>.
                      super__Head_base<0UL,_Resources_*,_false>._M_head_impl,
               &((this->polled_pipeline)._M_t.
                 super___uniq_ptr_impl<PolledPipelineDesc,_std::default_delete<PolledPipelineDesc>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_PolledPipelineDesc_*,_std::default_delete<PolledPipelineDesc>_>
                 .super__Head_base<0UL,_PolledPipelineDesc_*,_false>._M_head_impl)->pipeline_);
    std::__uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>::reset
              ((__uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_> *)&this->engine,
               pVVar2);
    VideoEngine::setCanvasResolution
              ((this->engine)._M_t.
               super___uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>._M_t.
               super__Tuple_impl<0UL,_VideoEngine_*,_std::default_delete<VideoEngine>_>.
               super__Head_base<0UL,_VideoEngine_*,_false>._M_head_impl,
               c_mode_res[this->mode_index].w,c_mode_res[this->mode_index].h);
  }
  pVVar2 = (this->engine)._M_t.super___uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>
           ._M_t.super__Tuple_impl<0UL,_VideoEngine_*,_std::default_delete<VideoEngine>_>.
           super__Head_base<0UL,_VideoEngine_*,_false>._M_head_impl;
  if (pVVar2 != (VideoEngine *)0x0) {
    VideoEngine::paint(pVVar2,paint::frame_seq,(this->preview).w,(this->preview).h,tc->row,dt,scope)
    ;
    return;
  }
  return;
}

Assistant:

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}